

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_deflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGCompressSettings *settings)

{
  uint *puVar1;
  undefined1 auVar2 [64];
  uchar uVar3;
  int iVar4;
  size_t __size;
  size_t sVar5;
  uint *puVar6;
  uint *puVar7;
  uint *puVar8;
  undefined4 uVar9;
  undefined8 __s;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int *__s_00;
  int *__s_01;
  unsigned_short *puVar14;
  unsigned_short *puVar15;
  unsigned_short *puVar16;
  long lVar17;
  ulong uVar18;
  uchar *puVar19;
  uchar *puVar20;
  uint *puVar21;
  undefined1 (*frequencies) [64];
  size_t sVar22;
  ulong uVar23;
  size_t sVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  size_t sVar28;
  ulong uVar29;
  ulong uVar30;
  byte bVar31;
  int iVar32;
  long lVar33;
  ulong uVar34;
  size_t sVar35;
  ulong uVar36;
  ulong uVar37;
  bool bVar38;
  bool bVar39;
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  ucvector v;
  size_t bp;
  uivector bitlen_lld_e;
  HuffmanTree tree_ll;
  uivector bitlen_lld;
  undefined1 (*local_158) [64];
  HuffmanTree tree_cl;
  HuffmanTree tree_d;
  uivector local_f8;
  uivector lz77_encoded;
  Hash local_b0;
  ulong local_80;
  undefined1 local_78 [72];
  
  v.data = *out;
  v.size = *outsize;
  bp = 0;
  uVar13 = settings->btype;
  uVar10 = 0x3d;
  if (uVar13 < 3) {
    sVar28 = insize;
    v.allocsize = v.size;
    if (uVar13 != 1) {
      if (uVar13 == 0) {
        if (insize + 0xfffe < 0xffff) {
          uVar10 = 0;
        }
        else {
          uVar18 = (insize + 0xfffe) / 0xffff;
          uVar34 = 0;
          auVar40._60_4_ = 0;
          auVar40._0_60_ = local_78._4_60_;
          local_78._0_64_ = auVar40 << 0x20;
          do {
            sVar28 = v.size;
            uVar36 = v.size + 1;
            puVar19 = v.data;
            uVar27 = v.allocsize;
            if (v.allocsize < uVar36) {
              uVar27 = uVar36 * 3 >> 1;
              if (v.allocsize * 2 < uVar36) {
                uVar27 = uVar36;
              }
              puVar19 = (uchar *)realloc(v.data,uVar27);
              if (puVar19 != (uchar *)0x0) goto LAB_004e1440;
            }
            else {
LAB_004e1440:
              v.allocsize = uVar27;
              v.data = puVar19;
              v.data[sVar28] = uVar34 == uVar18 - 1;
              v.size = uVar36;
            }
            sVar28 = v.size;
            uVar9 = local_78._0_4_;
            uVar27 = (ulong)(uint)local_78._0_4_;
            iVar4 = (int)insize - local_78._0_4_;
            if (0xfffe < insize - uVar27) {
              iVar4 = 0xffff;
            }
            uVar37 = v.size + 1;
            puVar19 = v.data;
            uVar36 = v.allocsize;
            if (v.allocsize < uVar37) {
              uVar36 = uVar37 * 3 >> 1;
              if (v.allocsize * 2 < uVar37) {
                uVar36 = uVar37;
              }
              puVar19 = (uchar *)realloc(v.data,uVar36);
              if (puVar19 != (uchar *)0x0) goto LAB_004e14c2;
            }
            else {
LAB_004e14c2:
              v.allocsize = uVar36;
              v.data = puVar19;
              v.data[sVar28] = (uchar)iVar4;
              v.size = uVar37;
            }
            sVar28 = v.size;
            uVar37 = v.size + 1;
            puVar19 = v.data;
            uVar36 = v.allocsize;
            if (v.allocsize < uVar37) {
              uVar36 = uVar37 * 3 >> 1;
              if (v.allocsize * 2 < uVar37) {
                uVar36 = uVar37;
              }
              puVar19 = (uchar *)realloc(v.data,uVar36);
              if (puVar19 != (uchar *)0x0) goto LAB_004e151c;
            }
            else {
LAB_004e151c:
              v.allocsize = uVar36;
              v.data = puVar19;
              v.data[sVar28] = (uchar)((uint)iVar4 >> 8);
              v.size = uVar37;
            }
            sVar28 = v.size;
            uVar37 = v.size + 1;
            puVar19 = v.data;
            uVar36 = v.allocsize;
            if (v.allocsize < uVar37) {
              uVar36 = uVar37 * 3 >> 1;
              if (v.allocsize * 2 < uVar37) {
                uVar36 = uVar37;
              }
              puVar19 = (uchar *)realloc(v.data,uVar36);
              if (puVar19 != (uchar *)0x0) goto LAB_004e157b;
            }
            else {
LAB_004e157b:
              v.allocsize = uVar36;
              v.data = puVar19;
              v.data[sVar28] = (uchar)(0xffff - iVar4);
              v.size = uVar37;
            }
            sVar28 = v.size;
            uVar37 = v.size + 1;
            puVar19 = v.data;
            uVar36 = v.allocsize;
            if (v.allocsize < uVar37) {
              uVar36 = uVar37 * 3 >> 1;
              if (v.allocsize * 2 < uVar37) {
                uVar36 = uVar37;
              }
              puVar19 = (uchar *)realloc(v.data,uVar36);
              if (puVar19 != (uchar *)0x0) goto LAB_004e15d2;
            }
            else {
LAB_004e15d2:
              v.allocsize = uVar36;
              v.data = puVar19;
              v.data[sVar28] = (uchar)((uint)(0xffff - iVar4) >> 8);
              v.size = uVar37;
            }
            if (uVar27 < insize) {
              uVar36 = uVar27;
              uVar37 = 0;
              do {
                sVar28 = v.size;
                uVar3 = in[uVar36];
                uVar29 = v.size + 1;
                puVar19 = v.data;
                uVar36 = v.allocsize;
                if (v.allocsize < uVar29) {
                  uVar36 = uVar29 * 3 >> 1;
                  if (v.allocsize * 2 < uVar29) {
                    uVar36 = uVar29;
                  }
                  puVar19 = (uchar *)realloc(v.data,uVar36);
                  if (puVar19 != (uchar *)0x0) goto LAB_004e1643;
                }
                else {
LAB_004e1643:
                  v.allocsize = uVar36;
                  v.data = puVar19;
                  v.data[sVar28] = uVar3;
                  v.size = uVar29;
                }
                uVar29 = uVar37 + 1;
              } while ((uVar37 < 0xfffe) &&
                      (uVar36 = uVar27 + 1 + uVar37 & 0xffffffff, uVar37 = uVar29, uVar36 < insize))
              ;
              local_78._0_4_ = uVar9 + (int)uVar29;
            }
            uVar34 = uVar34 + 1;
          } while (uVar34 != uVar18);
          uVar10 = 0;
        }
        goto LAB_004e270e;
      }
      uVar18 = 0xfff8;
      if (0xfff8 < insize >> 3) {
        uVar18 = insize >> 3;
      }
      if (0x3fff7 < uVar18) {
        uVar18 = 0x3fff8;
      }
      sVar28 = uVar18 + 8;
    }
    uVar18 = 1;
    if (!CARRY8(insize - 1,sVar28)) {
      uVar18 = ((insize - 1) + sVar28) / sVar28;
    }
    uVar34 = (ulong)settings->windowsize;
    __s_00 = (int *)malloc(0x40000);
    local_b0.head = __s_00;
    __s_01 = (int *)malloc(uVar34 * 4);
    __size = uVar34 * 2;
    local_b0.val = __s_01;
    puVar14 = (unsigned_short *)malloc(__size);
    local_b0.chain = puVar14;
    puVar15 = (unsigned_short *)malloc(__size);
    local_b0.zeros = puVar15;
    local_b0.headz = (int *)malloc(0x40c);
    local_78._0_8_ = local_b0.headz;
    puVar16 = (unsigned_short *)malloc(__size);
    uVar10 = 0x53;
    local_b0.chainz = puVar16;
    if (__s_01 == (int *)0x0) {
      bVar39 = false;
    }
    else if (((__s_00 == (int *)0x0) || (puVar14 == (unsigned_short *)0x0)) ||
            (bVar39 = false, puVar15 == (unsigned_short *)0x0)) {
      bVar39 = false;
    }
    else if ((local_78._0_8_ != 0) && (puVar16 != (unsigned_short *)0x0)) {
      memset(__s_00,0xff,0x40000);
      if (uVar34 == 0) {
        memset((void *)local_78._0_8_,0xff,0x40c);
      }
      else {
        memset(__s_01,0xff,uVar34 * 4);
        auVar40 = vpbroadcastq_avx512f();
        lVar33 = (uVar34 + 0x1f >> 5) * 0x40;
        auVar41 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
        auVar42 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
        auVar43 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar44 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar45 = vpmovsxbw_avx512bw(_DAT_00a3d1c0);
        lVar17 = 0;
        auVar46 = vpbroadcastq_avx512f(ZEXT816(0x20));
        auVar47 = vpbroadcastw_avx512bw(ZEXT216(0x20));
        do {
          vpcmpuq_avx512f(auVar44,auVar40,2);
          vpcmpuq_avx512f(auVar43,auVar40,2);
          vpcmpuq_avx512f(auVar42,auVar40,2);
          vpcmpuq_avx512f(auVar41,auVar40,2);
          auVar2 = vmovdqu16_avx512bw(auVar45);
          *(undefined1 (*) [64])((long)puVar14 + lVar17) = auVar2;
          auVar44 = vpaddq_avx512f(auVar44,auVar46);
          auVar43 = vpaddq_avx512f(auVar43,auVar46);
          auVar42 = vpaddq_avx512f(auVar42,auVar46);
          auVar41 = vpaddq_avx512f(auVar41,auVar46);
          auVar45 = vpaddw_avx512bw(auVar45,auVar47);
          lVar17 = lVar17 + 0x40;
        } while (lVar33 != lVar17);
        __s = local_78._0_8_;
        local_78._0_64_ = vmovdqu64_avx512f(auVar40);
        memset((void *)__s,0xff,0x40c);
        auVar40 = vpbroadcastw_avx512bw(ZEXT216(0x20));
        auVar41 = vpbroadcastq_avx512f(ZEXT816(0x20));
        auVar42 = vmovdqu64_avx512f(local_78._0_64_);
        auVar43 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
        auVar44 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
        auVar45 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar46 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar47 = vpmovsxbw_avx512bw(_DAT_00a3d1c0);
        lVar17 = 0;
        do {
          vpcmpuq_avx512f(auVar46,auVar42,2);
          vpcmpuq_avx512f(auVar45,auVar42,2);
          vpcmpuq_avx512f(auVar44,auVar42,2);
          vpcmpuq_avx512f(auVar43,auVar42,2);
          auVar2 = vmovdqu16_avx512bw(auVar47);
          *(undefined1 (*) [64])((long)puVar16 + lVar17) = auVar2;
          auVar46 = vpaddq_avx512f(auVar46,auVar41);
          auVar45 = vpaddq_avx512f(auVar45,auVar41);
          auVar44 = vpaddq_avx512f(auVar44,auVar41);
          auVar43 = vpaddq_avx512f(auVar43,auVar41);
          auVar47 = vpaddw_avx512bw(auVar47,auVar40);
          lVar17 = lVar17 + 0x40;
        } while (lVar33 != lVar17);
      }
      uVar10 = 0;
      bVar39 = true;
    }
    if (bVar39) {
      if (uVar18 == 0) {
        uVar10 = 0;
      }
      else {
        local_80 = uVar18 - 1;
        lVar17 = 0;
        uVar10 = 0;
        uVar27 = 0;
        uVar34 = sVar28;
        puVar19 = in;
        do {
          uVar36 = uVar34;
          if (insize < uVar34) {
            uVar36 = insize;
          }
          bVar39 = uVar27 == local_80;
          uVar29 = uVar27 * sVar28;
          uVar37 = uVar29 + sVar28;
          if (insize <= uVar29 + sVar28) {
            uVar37 = insize;
          }
          if (settings->btype == 2) {
            local_78._0_8_ = lVar17;
            lz77_encoded.data = (uint *)0x0;
            lz77_encoded.size = 0;
            lz77_encoded.allocsize = 0;
            tree_ll.tree2d = (uint *)0x0;
            tree_ll.tree1d = (uint *)0x0;
            tree_ll.lengths = (uint *)0x0;
            tree_d.tree2d = (uint *)0x0;
            tree_d.tree1d = (uint *)0x0;
            tree_d.lengths = (uint *)0x0;
            tree_cl.tree2d = (uint *)0x0;
            tree_cl.tree1d = (uint *)0x0;
            tree_cl.lengths = (uint *)0x0;
            bitlen_lld.data = (uint *)0x0;
            bitlen_lld.size._0_4_ = 0;
            bitlen_lld.size._4_4_ = 0;
            bitlen_lld.allocsize = 0;
            bitlen_lld_e.data = (uint *)0x0;
            bitlen_lld_e.size = 0;
            bitlen_lld_e.allocsize = 0;
            local_f8.data = (uint *)0x0;
            local_f8.size = 0;
            local_f8.allocsize = 0;
            if (settings->use_lz77 == 0) {
              uVar13 = uivector_resize(&lz77_encoded,uVar37 - uVar29);
              if (uVar13 != 0) {
                if (uVar29 < uVar37) {
                  lVar33 = 0;
                  do {
                    lz77_encoded.data[lVar33] = (uint)puVar19[lVar33];
                    lVar33 = lVar33 + 1;
                  } while (uVar36 + lVar17 != lVar33);
                }
                goto LAB_004e1b76;
              }
              uVar10 = 0x53;
LAB_004e1d4a:
              puVar21 = (uint *)0x0;
              local_158 = (undefined1 (*) [64])0x0;
              frequencies = (undefined1 (*) [64])0x0;
            }
            else {
              uVar10 = encodeLZ77(&lz77_encoded,&local_b0,in,uVar29,uVar37,settings->windowsize,
                                  settings->minmatch,settings->nicematch,settings->lazymatching);
              if (uVar10 != 0) goto LAB_004e1d4a;
LAB_004e1b76:
              puVar21 = (uint *)malloc(0x478);
              uVar13 = 0x53;
              uVar10 = uVar13;
              if (puVar21 == (uint *)0x0) {
                local_158 = (undefined1 (*) [64])0x0;
                frequencies = (undefined1 (*) [64])0x0;
              }
              else {
                memset(puVar21,0,0x478);
                local_158 = (undefined1 (*) [64])malloc(0x78);
                if (local_158 == (undefined1 (*) [64])0x0) {
                  frequencies = (undefined1 (*) [64])0x0;
                }
                else {
                  auVar40 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
                  *(undefined1 (*) [64])(*local_158 + 0x38) = auVar40;
                  auVar40 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
                  *local_158 = auVar40;
                  if (lz77_encoded.size != 0) {
                    sVar22 = 0;
                    do {
                      uVar10 = lz77_encoded.data[sVar22];
                      puVar21[uVar10] = puVar21[uVar10] + 1;
                      if (0x100 < (ulong)uVar10) {
                        *(int *)(*local_158 + (ulong)lz77_encoded.data[sVar22 + 2] * 4) =
                             *(int *)(*local_158 + (ulong)lz77_encoded.data[sVar22 + 2] * 4) + 1;
                        sVar22 = sVar22 + 3;
                      }
                      sVar22 = sVar22 + 1;
                    } while (sVar22 != lz77_encoded.size);
                  }
                  puVar21[0x100] = 1;
                  uVar10 = HuffmanTree_makeFromFrequencies(&tree_ll,puVar21,0x101,0x11e,0xf);
                  if (uVar10 == 0) {
                    uVar10 = HuffmanTree_makeFromFrequencies(&tree_d,(uint *)local_158,2,0x1e,0xf);
                    uVar12 = tree_d.numcodes;
                    puVar6 = tree_ll.lengths;
                    if (uVar10 == 0) {
                      uVar36 = 0x11e;
                      if (tree_ll.numcodes < 0x11e) {
                        uVar36 = (ulong)tree_ll.numcodes;
                      }
                      uVar37 = 0x1e;
                      if (tree_d.numcodes < 0x1e) {
                        uVar37 = (ulong)tree_d.numcodes;
                      }
                      if (tree_ll.numcodes != 0) {
                        uVar29 = 0;
                        do {
                          uVar10 = puVar6[uVar29];
                          uVar11 = uivector_resize(&bitlen_lld,
                                                   CONCAT44(bitlen_lld.size._4_4_,
                                                            (uint)bitlen_lld.size) + 1);
                          if (uVar11 != 0) {
                            bitlen_lld.data
                            [CONCAT44(bitlen_lld.size._4_4_,(uint)bitlen_lld.size) + -1] = uVar10;
                          }
                          uVar29 = uVar29 + 1;
                        } while (uVar36 != uVar29);
                      }
                      puVar6 = tree_d.lengths;
                      if (uVar12 != 0) {
                        uVar29 = 0;
                        do {
                          uVar10 = puVar6[uVar29];
                          uVar12 = uivector_resize(&bitlen_lld,
                                                   CONCAT44(bitlen_lld.size._4_4_,
                                                            (uint)bitlen_lld.size) + 1);
                          if (uVar12 != 0) {
                            bitlen_lld.data
                            [CONCAT44(bitlen_lld.size._4_4_,(uint)bitlen_lld.size) + -1] = uVar10;
                          }
                          uVar29 = uVar29 + 1;
                        } while (uVar37 != uVar29);
                      }
                      puVar6 = bitlen_lld.data;
                      uVar29 = (ulong)(uint)bitlen_lld.size;
                      if (uVar29 != 0) {
                        uVar26 = 0;
                        do {
                          uVar30 = uVar26 + 1;
                          uVar25 = 0;
                          if (uVar30 < uVar29) {
                            uVar25 = 0;
                            uVar23 = uVar30;
                            do {
                              if (puVar6[uVar23] != puVar6[uVar26]) break;
                              uVar25 = (ulong)((int)uVar25 + 1);
                              uVar23 = uVar30 + uVar25;
                            } while (uVar23 < uVar29);
                          }
                          uVar10 = puVar6[uVar26];
                          uVar12 = (uint)uVar25;
                          if ((uVar12 < 2) || (uVar10 != 0)) {
                            if (2 < uVar12) {
                              uVar11 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                              if (uVar11 != 0) {
                                bitlen_lld_e.data[bitlen_lld_e.size - 1] = uVar10;
                              }
                              uVar30 = uVar25 / 6;
                              if (5 < uVar12) {
                                do {
                                  uVar10 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                                  if (uVar10 != 0) {
                                    bitlen_lld_e.data[bitlen_lld_e.size - 1] = 0x10;
                                  }
                                  uVar10 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                                  if (uVar10 != 0) {
                                    bitlen_lld_e.data[bitlen_lld_e.size - 1] = 3;
                                  }
                                  uVar30 = uVar30 - 1;
                                } while (uVar30 != 0);
                              }
                              uVar10 = uVar12 + (int)(uVar25 / 6) * -6;
                              if (uVar10 < 3) {
                                uVar10 = uVar12 - uVar10;
                                goto LAB_004e2256;
                              }
                              uVar12 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                              if (uVar12 != 0) {
                                bitlen_lld_e.data[bitlen_lld_e.size - 1] = 0x10;
                              }
                              uVar12 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                              if (uVar12 != 0) {
                                bitlen_lld_e.data[bitlen_lld_e.size - 1] = uVar10 - 3;
                              }
                              goto LAB_004e225b;
                            }
                            uVar12 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                            if (uVar12 != 0) {
                              bitlen_lld_e.data[bitlen_lld_e.size - 1] = uVar10;
                            }
                          }
                          else {
                            uVar10 = uVar12 + 1;
                            if (uVar10 < 0xb) {
                              uVar10 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                              if (uVar10 != 0) {
                                bitlen_lld_e.data[bitlen_lld_e.size - 1] = 0x11;
                              }
                              uVar10 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                              if (uVar10 != 0) {
                                bitlen_lld_e.data[bitlen_lld_e.size - 1] = uVar12 - 2;
                              }
                            }
                            else {
                              if (0x89 < uVar10) {
                                uVar10 = 0x8a;
                              }
                              uVar12 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                              if (uVar12 != 0) {
                                bitlen_lld_e.data[bitlen_lld_e.size - 1] = 0x12;
                              }
                              uVar12 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                              if (uVar12 != 0) {
                                bitlen_lld_e.data[bitlen_lld_e.size - 1] = uVar10 - 0xb;
                              }
                              uVar10 = uVar10 - 1;
LAB_004e2256:
                              uVar25 = (ulong)uVar10;
                            }
LAB_004e225b:
                            uVar26 = uVar26 + uVar25;
                          }
                          uVar26 = uVar26 + 1;
                        } while (uVar26 != uVar29);
                      }
                      frequencies = (undefined1 (*) [64])malloc(0x4c);
                      sVar22 = bitlen_lld_e.size;
                      uVar10 = uVar13;
                      if (frequencies != (undefined1 (*) [64])0x0) {
                        auVar40 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
                        *(undefined1 (*) [64])(*frequencies + 0xc) = auVar40;
                        auVar40 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
                        *frequencies = auVar40;
                        if (bitlen_lld_e.size != 0) {
                          sVar24 = 0;
                          do {
                            uVar10 = bitlen_lld_e.data[sVar24];
                            *(int *)(*frequencies + (ulong)uVar10 * 4) =
                                 *(int *)(*frequencies + (ulong)uVar10 * 4) + 1;
                            sVar24 = (sVar24 - ((ulong)uVar10 < 0x10)) + 2;
                          } while (sVar24 != bitlen_lld_e.size);
                        }
                        uVar10 = HuffmanTree_makeFromFrequencies
                                           (&tree_cl,(uint *)frequencies,0x13,0x13,7);
                        if (uVar10 == 0) {
                          uVar29 = (ulong)tree_cl.numcodes;
                          uVar12 = uivector_resize(&local_f8,uVar29);
                          uVar10 = uVar13;
                          if (uVar12 != 0) {
                            if (uVar29 != 0) {
                              lVar17 = 0;
                              do {
                                *(uint *)((long)local_f8.data + lVar17) =
                                     tree_cl.lengths[*(uint *)((long)CLCL_ORDER + lVar17)];
                                lVar17 = lVar17 + 4;
                              } while (uVar29 << 2 != lVar17);
                            }
                            do {
                              uVar13 = local_f8.data[local_f8.size - 1];
                              bVar38 = local_f8.size < 5;
                              if (bVar38 || uVar13 != 0) {
                                uVar10 = 0;
                                goto LAB_004e23c7;
                              }
                              uVar10 = uivector_resize(&local_f8,local_f8.size - 1);
                            } while (uVar10 != 0);
                            uVar10 = 0x53;
LAB_004e23c7:
                            sVar5 = bp;
                            sVar24 = v.size;
                            if (bVar38 || uVar13 != 0) {
                              if ((bp & 7) == 0) {
                                sVar35 = v.size + 1;
                                uVar13 = ucvector_reserve(&v,sVar35);
                                if (uVar13 != 0) {
                                  v.data[sVar24] = '\0';
                                  v.size = sVar35;
                                }
                              }
                              sVar24 = v.size;
                              v.data[v.size - 1] = v.data[v.size - 1] | bVar39 << ((byte)sVar5 & 7);
                              bp = sVar5 + 1;
                              if ((bp & 7) == 0) {
                                sVar35 = v.size + 1;
                                uVar13 = ucvector_reserve(&v,sVar35);
                                if (uVar13 != 0) {
                                  v.data[sVar24] = '\0';
                                  v.size = sVar35;
                                }
                              }
                              sVar24 = v.size;
                              uVar29 = sVar5 + 2;
                              if ((uVar29 & 7) == 0) {
                                sVar35 = v.size + 1;
                                bp = uVar29;
                                uVar13 = ucvector_reserve(&v,sVar35);
                                if (uVar13 != 0) {
                                  v.data[sVar24] = '\0';
                                  v.size = sVar35;
                                }
                              }
                              puVar6 = local_f8.data;
                              v.data[v.size - 1] = v.data[v.size - 1] | '\x01' << ((byte)uVar29 & 7)
                              ;
                              bp = sVar5 + 3;
                              iVar4 = (int)local_f8.size;
                              uVar26 = (ulong)(iVar4 - 4) + 3;
                              uVar29 = 0;
                              do {
                                uVar30 = uVar29;
                                if (uVar30 == iVar4 - 4) break;
                                uVar25 = uVar26 & 0xffffffff;
                                uVar26 = uVar26 - 1;
                                uVar29 = uVar30 + 1;
                              } while (local_f8.data[uVar25] == 0);
                              iVar32 = (int)(uVar30 + 1);
                              addBitsToStream(&bp,&v,(int)uVar36 - 0x101,5);
                              addBitsToStream(&bp,&v,(int)uVar37 - 1,5);
                              addBitsToStream(&bp,&v,(iVar4 - iVar32) - 3,4);
                              if (iVar4 + 1 != iVar32) {
                                uVar36 = 0;
                                do {
                                  addBitsToStream(&bp,&v,puVar6[uVar36],3);
                                  uVar36 = uVar36 + 1;
                                } while ((uint)(iVar4 - (int)uVar30) != uVar36);
                              }
                              puVar8 = tree_cl.lengths;
                              puVar7 = tree_cl.tree1d;
                              puVar6 = bitlen_lld_e.data;
                              if (sVar22 != 0) {
                                sVar24 = 0;
                                do {
                                  addHuffmanSymbol(&bp,&v,puVar7[puVar6[sVar24]],
                                                   puVar8[puVar6[sVar24]]);
                                  puVar1 = puVar6 + sVar24;
                                  if (*puVar1 - 0x10 < 3) {
                                    lVar17 = sVar24 + 1;
                                    sVar24 = sVar24 + 1;
                                    addBitsToStream(&bp,&v,puVar6[lVar17],
                                                    *(size_t *)
                                                     (&DAT_00a3cff0 + (ulong)(*puVar1 - 0x10) * 8));
                                  }
                                  sVar24 = sVar24 + 1;
                                } while (sVar24 != sVar22);
                              }
                              writeLZ77data(&bp,&v,&lz77_encoded,&tree_ll,&tree_d);
                              if (tree_ll.lengths[0x100] == 0) {
                                uVar10 = 0x40;
                              }
                              else {
                                addHuffmanSymbol(&bp,&v,tree_ll.tree1d[0x100],tree_ll.lengths[0x100]
                                                );
                                uVar10 = 0;
                              }
                            }
                          }
                        }
                      }
                    }
                    else {
                      frequencies = (undefined1 (*) [64])0x0;
                    }
                  }
                  else {
                    frequencies = (undefined1 (*) [64])0x0;
                  }
                }
              }
            }
            lz77_encoded.size = 0;
            lz77_encoded.allocsize = 0;
            free(lz77_encoded.data);
            lz77_encoded.data = (uint *)0x0;
            free(tree_ll.tree2d);
            free(tree_ll.tree1d);
            free(tree_ll.lengths);
            free(tree_d.tree2d);
            free(tree_d.tree1d);
            free(tree_d.lengths);
            free(tree_cl.tree2d);
            free(tree_cl.tree1d);
            free(tree_cl.lengths);
            free(puVar21);
            free(local_158);
            free(frequencies);
            bitlen_lld_e.size = 0;
            bitlen_lld_e.allocsize = 0;
            free(bitlen_lld_e.data);
            bitlen_lld_e.data = (uint *)0x0;
            bitlen_lld.size._0_4_ = 0;
            bitlen_lld.size._4_4_ = 0;
            bitlen_lld.allocsize = 0;
            free(bitlen_lld.data);
            bitlen_lld.data = (uint *)0x0;
            local_f8.size = 0;
            local_f8.allocsize = 0;
            free(local_f8.data);
            lVar17 = local_78._0_8_;
          }
          else if (settings->btype == 1) {
            local_78._0_8_ = lVar17;
            tree_ll.tree2d = (uint *)0x0;
            tree_ll.tree1d = (uint *)0x0;
            tree_ll.lengths = (uint *)0x0;
            tree_d.tree2d = (uint *)0x0;
            tree_d.tree1d = (uint *)0x0;
            tree_d.lengths = (uint *)0x0;
            generateFixedLitLenTree(&tree_ll);
            generateFixedDistanceTree(&tree_d);
            sVar24 = bp;
            sVar22 = v.size;
            if ((bp & 7) == 0) {
              uVar30 = v.size + 1;
              puVar20 = v.data;
              uVar26 = v.allocsize;
              if (v.allocsize < uVar30) {
                uVar26 = uVar30 * 3 >> 1;
                if (v.allocsize * 2 < uVar30) {
                  uVar26 = uVar30;
                }
                puVar20 = (uchar *)realloc(v.data,uVar26);
                if (puVar20 == (uchar *)0x0) goto LAB_004e1821;
              }
              v.allocsize = uVar26;
              v.data = puVar20;
              v.data[sVar22] = '\0';
              v.size = uVar30;
            }
LAB_004e1821:
            sVar22 = v.size;
            v.data[v.size - 1] = v.data[v.size - 1] | bVar39 << ((byte)sVar24 & 7);
            bp = sVar24 + 1;
            bVar31 = (byte)bp;
            if ((bp & 7) == 0) {
              uVar30 = v.size + 1;
              puVar20 = v.data;
              uVar26 = v.allocsize;
              if (v.allocsize < uVar30) {
                uVar26 = uVar30 * 3 >> 1;
                if (v.allocsize * 2 < uVar30) {
                  uVar26 = uVar30;
                }
                puVar20 = (uchar *)realloc(v.data,uVar26);
                if (puVar20 == (uchar *)0x0) goto LAB_004e18a7;
              }
              v.allocsize = uVar26;
              v.data = puVar20;
              v.data[sVar22] = '\0';
              v.size = uVar30;
            }
LAB_004e18a7:
            sVar22 = v.size;
            v.data[v.size - 1] = v.data[v.size - 1] | '\x01' << (bVar31 & 7);
            bp = sVar24 + 2;
            if ((bp & 7) == 0) {
              uVar30 = v.size + 1;
              puVar20 = v.data;
              uVar26 = v.allocsize;
              if (v.allocsize < uVar30) {
                uVar26 = uVar30 * 3 >> 1;
                if (v.allocsize * 2 < uVar30) {
                  uVar26 = uVar30;
                }
                puVar20 = (uchar *)realloc(v.data,uVar26);
                if (puVar20 == (uchar *)0x0) goto LAB_004e1921;
              }
              v.allocsize = uVar26;
              v.data = puVar20;
              v.data[sVar22] = '\0';
              v.size = uVar30;
            }
LAB_004e1921:
            puVar21 = tree_ll.lengths;
            bp = sVar24 + 3;
            if (settings->use_lz77 == 0) {
              uVar10 = 0;
              if (uVar29 < uVar37) {
                puVar6 = tree_ll.tree1d;
                lVar33 = 0;
                do {
                  addHuffmanSymbol(&bp,&v,puVar6[puVar19[lVar33]],puVar21[puVar19[lVar33]]);
                  lVar33 = lVar33 + 1;
                } while (uVar36 + lVar17 != lVar33);
                uVar10 = 0;
              }
            }
            else {
              tree_cl.tree2d = (uint *)0x0;
              tree_cl.tree1d = (uint *)0x0;
              tree_cl.lengths = (uint *)0x0;
              uVar10 = encodeLZ77((uivector *)&tree_cl,&local_b0,in,uVar29,uVar37,
                                  settings->windowsize,settings->minmatch,settings->nicematch,
                                  settings->lazymatching);
              if (uVar10 == 0) {
                writeLZ77data(&bp,&v,(uivector *)&tree_cl,&tree_ll,&tree_d);
              }
              tree_cl.tree1d = (uint *)0x0;
              tree_cl.lengths = (uint *)0x0;
              free(tree_cl.tree2d);
            }
            if (uVar10 == 0) {
              addHuffmanSymbol(&bp,&v,tree_ll.tree1d[0x100],tree_ll.lengths[0x100]);
            }
            free(tree_ll.tree2d);
            free(tree_ll.tree1d);
            free(tree_ll.lengths);
            free(tree_d.tree2d);
            free(tree_d.tree1d);
            free(tree_d.lengths);
            lVar17 = local_78._0_8_;
          }
          uVar27 = uVar27 + 1;
          if (uVar27 == uVar18) break;
          uVar34 = uVar34 + sVar28;
          lVar17 = lVar17 - sVar28;
          puVar19 = puVar19 + sVar28;
        } while (uVar10 == 0);
      }
      free(local_b0.head);
      free(local_b0.val);
      free(local_b0.chain);
      free(local_b0.zeros);
      free(local_b0.headz);
      free(local_b0.chainz);
    }
  }
LAB_004e270e:
  *out = v.data;
  *outsize = v.size;
  return uVar10;
}

Assistant:

unsigned lodepng_deflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGCompressSettings* settings)
{
  unsigned error;
  ucvector v;
  ucvector_init_buffer(&v, *out, *outsize);
  error = lodepng_deflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}